

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O3

bool processShaderConfig(uint32_t lineno,string *shaderConfig)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _List _Var3;
  pointer pbVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  ostream *poVar8;
  undefined8 uVar9;
  basic_ostream<char,_std::char_traits<char>_> *pbVar10;
  size_t sVar11;
  mapped_type *this;
  long lVar12;
  _Alloc_hider _Var13;
  string *define;
  pointer pbVar14;
  list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> callStack;
  CompileTask task;
  path compiledShaderName;
  path compiledShaderPath;
  path compiledPermutationName;
  string commandLine;
  path sourceFile;
  path compiledPermutationFile;
  CompilerOptions compilerOptions;
  ostringstream combinedDefines;
  undefined1 local_4a0 [40];
  _Alloc_hider local_478;
  size_type local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  undefined1 local_458 [32];
  _List local_438;
  size_type local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Alloc_hider local_418;
  size_type local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  _Alloc_hider local_3f8;
  size_type local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  _Alloc_hider local_3d8;
  size_type local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  key_type local_3b0;
  undefined1 local_390 [32];
  _List local_370;
  path local_368;
  path local_340;
  string local_318;
  string local_2f8;
  path local_2d8;
  path local_2b0;
  path local_288;
  CompilerOptions local_260;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_260.shaderName._M_dataplus._M_p = (pointer)&local_260.shaderName.field_2;
  local_260.shaderName._M_string_length = 0;
  local_260.shaderName.field_2._M_local_buf[0] = '\0';
  local_260.entryPoint._M_dataplus._M_p = (pointer)&local_260.entryPoint.field_2;
  local_260.entryPoint._M_string_length = 0;
  local_260.entryPoint.field_2._M_local_buf[0] = '\0';
  local_260.target._M_dataplus._M_p = (pointer)&local_260.target.field_2;
  local_260.target._M_string_length = 0;
  local_260.target.field_2._M_local_buf[0] = '\0';
  local_260.outputPath._M_dataplus._M_p = (pointer)&local_260.outputPath.field_2;
  local_260.outputPath._M_string_length = 0;
  local_260.outputPath.field_2._M_local_buf[0] = '\0';
  local_260.definitions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_260.definitions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_260.definitions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_260.errorMessage._M_dataplus._M_p = (pointer)&local_260.errorMessage.field_2;
  local_260.errorMessage._M_string_length = 0;
  local_260.errorMessage.field_2._M_local_buf[0] = '\0';
  pcVar2 = (shaderConfig->_M_dataplus)._M_p;
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_318,pcVar2,pcVar2 + shaderConfig->_M_string_length);
  bVar5 = CompilerOptions::parse(&local_260,&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    printError(lineno,&local_260.errorMessage);
    bVar5 = false;
    goto LAB_00109d9c;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pbVar4 = local_260.definitions.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_260.definitions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_260.definitions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar14 = local_260.definitions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(pbVar14->_M_dataplus)._M_p,pbVar14->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 != pbVar4);
  }
  std::__cxx11::stringbuf::str();
  uVar9 = std::_Hash_bytes((void *)local_458._0_8_,local_458._8_8_,0xc70f6907);
  if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
    operator_delete((void *)local_458._0_8_,CONCAT71(local_458._17_7_,local_458[0x10]) + 1);
  }
  std::filesystem::__cxx11::path::path((path *)local_390);
  if (local_260.outputPath._M_string_length == 0) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_4a0,&local_260.shaderName,auto_format);
    removeLeadingDotDots((path *)local_458,(path *)local_4a0);
    std::__cxx11::string::operator=((string *)local_390,(string *)local_458);
    _Var3._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         local_370._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    local_370._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         local_438._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    local_438._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0;
    if (_Var3._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
        != (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&local_370,
                 (_Impl *)_Var3._M_impl._M_t.
                          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          .
                          super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                          ._M_head_impl);
    }
    std::filesystem::__cxx11::path::clear((path *)local_458);
    std::filesystem::__cxx11::path::~path((path *)local_458);
    std::filesystem::__cxx11::path::~path((path *)local_4a0);
    std::filesystem::__cxx11::path::path<char[1],std::filesystem::__cxx11::path>
              ((path *)local_458,(char (*) [1])0x12b6f4,auto_format);
    std::filesystem::__cxx11::path::replace_extension((path *)local_390);
    std::filesystem::__cxx11::path::~path((path *)local_458);
    if ((local_260.entryPoint._M_string_length != 0) &&
       (iVar7 = std::__cxx11::string::compare((char *)&local_260.entryPoint), iVar7 != 0)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458,
                     "_",&local_260.entryPoint);
      std::filesystem::__cxx11::path::_M_concat(local_390,local_458._8_8_,local_458._0_8_);
      if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
        operator_delete((void *)local_458._0_8_,CONCAT71(local_458._17_7_,local_458[0x10]) + 1);
      }
    }
    std::filesystem::__cxx11::path::_M_concat(local_390,4,".bin");
  }
  else {
    std::filesystem::__cxx11::path::operator=((path *)local_390,&local_260.outputPath);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_4a0,&g_Options.inputFile,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_368,&local_260.shaderName,auto_format);
  std::filesystem::__cxx11::operator/(&local_2d8,(path *)local_458,&local_368);
  std::filesystem::__cxx11::path::~path(&local_368);
  std::filesystem::__cxx11::path::~path((path *)local_458);
  std::filesystem::__cxx11::path::~path((path *)local_4a0);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_458,&g_Options.outputPath,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::operator/(&local_368,(path *)local_458,(path *)local_4a0);
  std::filesystem::__cxx11::path::~path((path *)local_4a0);
  std::filesystem::__cxx11::path::~path((path *)local_458);
  cVar6 = std::filesystem::status(&local_368);
  if ((cVar6 == -1) || (cVar6 == '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"INFO: Creating directory ",0x19);
    pbVar10 = std::filesystem::__cxx11::operator<<
                        ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_368);
    std::ios::widen((char)*(undefined8 *)(*(long *)pbVar10 + -0x18) + (char)pbVar10);
    std::ostream::put((char)pbVar10);
    std::ostream::flush();
    std::filesystem::create_directories(&local_368);
LAB_0010990f:
    std::filesystem::__cxx11::path::path(&local_340,(path *)local_390);
    std::filesystem::__cxx11::path::path<char[1],std::filesystem::__cxx11::path>
              ((path *)local_458,(char (*) [1])0x12b6f4,auto_format);
    std::filesystem::__cxx11::path::replace_extension(&local_340);
    std::filesystem::__cxx11::path::~path((path *)local_458);
    if (local_260.definitions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_260.definitions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      sprintf(local_458,"_%08x",(ulong)((uint)((ulong)uVar9 >> 0x20) ^ (uint)uVar9));
      sVar11 = strlen(local_458);
      std::filesystem::__cxx11::path::_M_concat(&local_340,sVar11,local_458);
    }
    std::filesystem::__cxx11::path::_M_concat(&local_340,4,".bin");
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_458,&g_Options.outputPath,auto_format);
    std::filesystem::__cxx11::operator/(&local_288,(path *)local_458,&local_340);
    std::filesystem::__cxx11::path::~path((path *)local_458);
    buildCompilerCommandLine(&local_2f8,&local_260,&local_2d8,&local_288);
    local_458._0_8_ = local_458 + 0x10;
    local_458._8_8_ = 0;
    local_458[0x10] = '\0';
    local_430 = 0;
    local_428._M_local_buf[0] = '\0';
    local_418._M_p = (pointer)&local_408;
    local_410 = 0;
    local_408._M_local_buf[0] = '\0';
    local_3f8._M_p = (pointer)&local_3e8;
    local_3f0 = 0;
    local_3e8._M_local_buf[0] = '\0';
    local_3d0 = 0;
    local_3c8._M_local_buf[0] = '\0';
    local_438._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )&local_428;
    local_3d8._M_p = (pointer)&local_3c8;
    std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
               &local_2d8,(allocator<char> *)&local_3b0);
    std::__cxx11::string::operator=((string *)local_458,(string *)local_4a0);
    if ((path *)local_4a0._0_8_ != (path *)(local_4a0 + 0x10)) {
      operator_delete((void *)local_4a0._0_8_,local_4a0._16_8_ + 1);
    }
    std::__cxx11::string::_M_assign((string *)&local_438);
    std::__cxx11::string::_M_assign((string *)&local_418);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_3f8,(string *)local_4a0);
    if ((path *)local_4a0._0_8_ != (path *)(local_4a0 + 0x10)) {
      operator_delete((void *)local_4a0._0_8_,local_4a0._16_8_ + 1);
    }
    std::__cxx11::string::_M_assign((string *)&local_3d8);
    std::vector<CompileTask,_std::allocator<CompileTask>_>::push_back
              (&g_CompileTasks,(value_type *)local_458);
    if (local_260.definitions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_260.definitions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::filesystem::__cxx11::path::path((path *)local_4a0);
      local_470 = 0;
      local_468._M_local_buf[0] = '\0';
      local_478._M_p = (pointer)&local_468;
      std::filesystem::__cxx11::path::operator=((path *)local_4a0,&local_288);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)(local_4a0 + 0x28),(string *)&local_3b0);
      paVar1 = &local_3b0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::path(&local_2b0,(path *)local_390);
      local_3b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3b0,local_2b0._M_pathname._M_dataplus._M_p,
                 local_2b0._M_pathname._M_dataplus._M_p + local_2b0._M_pathname._M_string_length);
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<BlobEntry,_std::allocator<BlobEntry>_>_>_>_>
             ::operator[](&g_ShaderBlobs_abi_cxx11_,&local_3b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_2b0);
      std::vector<BlobEntry,_std::allocator<BlobEntry>_>::push_back(this,(value_type *)local_4a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_p != &local_468) {
        operator_delete(local_478._M_p,
                        CONCAT71(local_468._M_allocated_capacity._1_7_,local_468._M_local_buf[0]) +
                        1);
      }
      std::filesystem::__cxx11::path::~path((path *)local_4a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_p != &local_3c8) {
      operator_delete(local_3d8._M_p,
                      CONCAT71(local_3c8._M_allocated_capacity._1_7_,local_3c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_p != &local_3e8) {
      operator_delete(local_3f8._M_p,
                      CONCAT71(local_3e8._M_allocated_capacity._1_7_,local_3e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_p != &local_408) {
      operator_delete(local_418._M_p,
                      CONCAT71(local_408._M_allocated_capacity._1_7_,local_408._M_local_buf[0]) + 1)
      ;
    }
    if (local_438._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
        != (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )&local_428) {
      operator_delete((void *)local_438._M_impl._M_t.
                              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              .
                              super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                              ._M_head_impl,
                      CONCAT71(local_428._M_allocated_capacity._1_7_,local_428._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
      operator_delete((void *)local_458._0_8_,CONCAT71(local_458._17_7_,local_458[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_288);
    std::filesystem::__cxx11::path::~path(&local_340);
    bVar5 = true;
  }
  else {
    if (g_Options.force != false) goto LAB_0010990f;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_4a0,&g_Options.outputPath,auto_format);
    std::filesystem::__cxx11::operator/((path *)local_458,(path *)local_4a0,(path *)local_390);
    std::filesystem::__cxx11::path::~path((path *)local_4a0);
    cVar6 = std::filesystem::status((path *)local_458);
    if ((cVar6 == -1) || (cVar6 == '\0')) {
      std::filesystem::__cxx11::path::~path((path *)local_458);
      goto LAB_0010990f;
    }
    lVar12 = std::filesystem::last_write_time((path *)local_458);
    local_340._M_pathname._M_dataplus._M_p = (pointer)0x0;
    local_4a0._16_8_ = 0;
    local_4a0._0_8_ = (path *)local_4a0;
    local_4a0._8_8_ = (path *)local_4a0;
    bVar5 = getHierarchicalUpdateTime
                      (&local_2d8,
                       (list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                        *)local_4a0,(file_time_type *)&local_340);
    if (bVar5) {
      _Var13._M_p = (pointer)g_ConfigWriteTime;
      if ((long)g_ConfigWriteTime.__d.__r < (long)local_340._M_pathname._M_dataplus._M_p) {
        _Var13._M_p = local_340._M_pathname._M_dataplus._M_p;
      }
      std::__cxx11::
      _List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      _M_clear((_List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                *)local_4a0);
      std::filesystem::__cxx11::path::~path((path *)local_458);
      bVar5 = true;
      if (lVar12 <= (long)_Var13._M_p) goto LAB_0010990f;
    }
    else {
      std::__cxx11::
      _List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      _M_clear((_List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                *)local_4a0);
      std::filesystem::__cxx11::path::~path((path *)local_458);
      bVar5 = false;
    }
  }
  std::filesystem::__cxx11::path::~path(&local_368);
  std::filesystem::__cxx11::path::~path(&local_2d8);
  std::filesystem::__cxx11::path::~path((path *)local_390);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_00109d9c:
  CompilerOptions::~CompilerOptions(&local_260);
  return bVar5;
}

Assistant:

bool processShaderConfig(uint32_t lineno, const string& shaderConfig)
{
	CompilerOptions compilerOptions;
	if (!compilerOptions.parse(shaderConfig))
	{
		printError(lineno, compilerOptions.errorMessage);
		return false;
	}
	
	ostringstream combinedDefines;
	for (const string& define : compilerOptions.definitions)
	{
		combinedDefines << define << " ";
	}

	uint32_t permutationHash = nvrhi::hash_to_u32(std::hash<std::string>()(combinedDefines.str()));

	fs::path compiledShaderName;
	if (compilerOptions.outputPath.empty())
	{
		compiledShaderName = removeLeadingDotDots(compilerOptions.shaderName);
		compiledShaderName.replace_extension("");
		if (!compilerOptions.entryPoint.empty() && compilerOptions.entryPoint != "main")
			compiledShaderName += "_" + compilerOptions.entryPoint;
		compiledShaderName += ".bin";
	}
	else
	{
		compiledShaderName = compilerOptions.outputPath;
	}

	fs::path sourceFile = fs::path(g_Options.inputFile).parent_path() / compilerOptions.shaderName;

	fs::path compiledShaderPath = g_Options.outputPath / compiledShaderName.parent_path();
	if (!fs::exists(compiledShaderPath))
	{
		cout << "INFO: Creating directory " << compiledShaderPath << endl;
		fs::create_directories(compiledShaderPath);
	}
	else if(!g_Options.force)
	{
		fs::path compiledShaderFile = g_Options.outputPath / compiledShaderName;
		if (fs::exists(compiledShaderFile))
		{
			fs::file_time_type compiledFileTime = fs::last_write_time(compiledShaderFile);

			fs::file_time_type sourceHierarchyTime;
			list<fs::path> callStack;
			if (!getHierarchicalUpdateTime(sourceFile, callStack, sourceHierarchyTime))
				return false;

			sourceHierarchyTime = std::max(sourceHierarchyTime, g_ConfigWriteTime);

			if (compiledFileTime > sourceHierarchyTime)
				return true;
		}
	}

	fs::path compiledPermutationName = compiledShaderName;
	compiledPermutationName.replace_extension("");
	if (compilerOptions.definitions.size() > 0)
	{
		char buf[16];
		sprintf(buf, "_%08x", permutationHash);
		compiledPermutationName += buf;
	}
	compiledPermutationName += ".bin";

	fs::path compiledPermutationFile = g_Options.outputPath / compiledPermutationName;

	string commandLine = buildCompilerCommandLine(compilerOptions, sourceFile, compiledPermutationFile);
	
	CompileTask task;
	task.sourceFile = sourceFile.generic_string();
	task.shaderName = compilerOptions.shaderName;
	task.entryPoint = compilerOptions.entryPoint;
	task.combinedDefines = combinedDefines.str();
	task.commandLine = commandLine;
	g_CompileTasks.push_back(task);

	if (!compilerOptions.definitions.empty())
	{
		BlobEntry entry;
		entry.compiledPermutationFile = compiledPermutationFile;
		entry.permutation = combinedDefines.str();

		vector<BlobEntry>& entries = g_ShaderBlobs[path_string(compiledShaderName)];
		entries.push_back(entry);
	}

	return true;
}